

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall S2BooleanOperation::Impl::IsFullPolygonResult(Impl *this,Graph *g,S2Error *error)

{
  S2BooleanOperation *pSVar1;
  S2ShapeIndex *a;
  S2ShapeIndex *b;
  bool bVar2;
  S2LogMessage SStack_18;
  
  pSVar1 = this->op_;
  if (pSVar1->op_type_ < 4) {
    a = pSVar1->regions_[0];
    b = pSVar1->regions_[1];
    switch(pSVar1->op_type_) {
    case UNION:
      bVar2 = IsFullPolygonUnion(this,a,b);
      return bVar2;
    case INTERSECTION:
      bVar2 = IsFullPolygonIntersection(this,a,b);
      return bVar2;
    case DIFFERENCE:
      bVar2 = IsFullPolygonDifference(this,a,b);
      return bVar2;
    case SYMMETRIC_DIFFERENCE:
      bVar2 = IsFullPolygonSymmetricDifference(this,a,b);
      return bVar2;
    }
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x811,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Invalid S2BooleanOperation::OpType");
  abort();
}

Assistant:

bool S2BooleanOperation::Impl::IsFullPolygonResult(
    const S2Builder::Graph& g, S2Error* error) const {
  // If there are no edges of dimension 2, the result could be either the
  // empty polygon or the full polygon.  Note that this is harder to determine
  // than you might think due to snapping.  For example, the union of two
  // non-empty polygons can be empty, because both polygons consist of tiny
  // loops that are eliminated by snapping.  Similarly, even if two polygons
  // both contain a common point their intersection can still be empty.
  //
  // We distinguish empty from full results using two heuristics:
  //
  //  1. We compute a bit mask representing the subset of the six S2 cube faces
  //     intersected by each input geometry, and use this to determine if only
  //     one of the two results is possible.  (This test is very fast.)  Note
  //     that snapping will never cause the result to cover an entire extra
  //     cube face because the maximum allowed snap radius is too small.
  S2_DCHECK_LE(S2Builder::SnapFunction::kMaxSnapRadius().degrees(), 70);
  //
  //  2. We compute the area of each input geometry, and use this to bound the
  //     minimum and maximum area of the result.  If only one of {0, 4*Pi} is
  //     possible then we are done.  If neither is possible then we choose the
  //     one that is closest to being possible (since snapping can change the
  //     result area).  Both results are possible only when computing the
  //     symmetric difference of two regions of area 2*Pi each, in which case we
  //     must resort to additional heuristics (see below).
  //
  // TODO(ericv): Implement a predicate that uses the results of edge snapping
  // directly, rather than computing areas.  This would not only be much faster
  // but would also allows all cases to be handled 100% robustly.
  const S2ShapeIndex& a = *op_->regions_[0];
  const S2ShapeIndex& b = *op_->regions_[1];
  switch (op_->op_type()) {
    case OpType::UNION:
      return IsFullPolygonUnion(a, b);

    case OpType::INTERSECTION:
      return IsFullPolygonIntersection(a, b);

    case OpType::DIFFERENCE:
      return IsFullPolygonDifference(a, b);

    case OpType::SYMMETRIC_DIFFERENCE:
      return IsFullPolygonSymmetricDifference(a, b);

    default:
      S2_LOG(FATAL) << "Invalid S2BooleanOperation::OpType";
      return false;
  }
}